

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ground_plane.cpp
# Opt level: O0

void __thiscall polyscope::render::GroundPlane::draw(GroundPlane *this,bool isRedraw)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  float *pfVar4;
  __tuple_element_t<0UL,_tuple<vec<3,_float,_(qualifier)0>,_vec<3,_float,_(qualifier)0>_>_> *p_Var5;
  __tuple_element_t<1UL,_tuple<vec<3,_float,_(qualifier)0>,_vec<3,_float,_(qualifier)0>_>_> *p_Var6;
  element_type *peVar7;
  reference pvVar8;
  col_type *pcVar9;
  element_type *peVar10;
  __shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  element_type *peVar12;
  byte in_SIL;
  long in_RDI;
  undefined1 auVar13 [64];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar22 [16];
  vec4 vVar23;
  vec<3,_float,_(glm::qualifier)0> vVar24;
  int i_1;
  int nBlur;
  mat4 projMat;
  mat4 origViewMat_1;
  int i;
  mat4 mirrorMat;
  vec3 tVec;
  mat3 mirrorMat3;
  vec3 mirrorN;
  mat4 origViewMat;
  anon_class_64_8_eb2a8976 setUniforms;
  int factor;
  vec2 viewportDim;
  vec4 viewport;
  double groundHeight;
  double heightEPS;
  double bboxHeight;
  double bboxBottom;
  vec3 baseRight;
  vec3 baseForward;
  vec3 baseUp;
  float sign;
  int iP;
  element_type *in_stack_fffffffffffff978;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff980;
  mat<3,_3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff988;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff990;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffff9b8;
  allocator *paVar25;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  int iVar26;
  undefined4 in_stack_fffffffffffff9e8;
  uint uVar27;
  float scalar;
  vec<3,_float,_(glm::qualifier)0> *v;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  float local_5ac;
  undefined1 local_591 [40];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [55];
  allocator local_509;
  string local_508 [32];
  int local_4e8;
  int local_4e4;
  undefined1 local_4e0 [64];
  undefined4 local_4a0;
  GroundPlane *in_stack_fffffffffffffba0;
  int local_41c;
  vec<3,_float,_(glm::qualifier)0> local_418;
  undefined1 local_40c [52];
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  anon_class_64_8_eb2a8976 *in_stack_fffffffffffffd50;
  vec<3,_float,_(glm::qualifier)0> local_1e4 [4];
  vec<3,_float,_(glm::qualifier)0> local_1b4 [8];
  GroundPlane *in_stack_fffffffffffffeb0;
  undefined1 local_128 [64];
  vec<3,_float,_(glm::qualifier)0> local_e4;
  vec<2,_float,_(glm::qualifier)0> *local_d0;
  vec<3,_float,_(glm::qualifier)0> *local_c8;
  vec<3,_float,_(glm::qualifier)0> *local_c0;
  length_type *local_b8;
  float *local_b0;
  vec<3,_float,_(glm::qualifier)0> *local_a8;
  double *local_a0;
  int local_94;
  vec<2,_float,_(glm::qualifier)0> local_90;
  vec<4,_float,_(glm::qualifier)0> local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  vec<3,_float,_(glm::qualifier)0> local_54;
  vec<3,_float,_(glm::qualifier)0> local_48;
  vec<3,_float,_(glm::qualifier)0> local_3c [3];
  float local_14;
  length_type local_10;
  byte local_9;
  undefined1 auVar18 [56];
  undefined1 auVar21 [56];
  
  local_9 = in_SIL & 1;
  if ((options::groundPlaneMode != 0) && (view::style != 2)) {
    if ((*(byte *)(in_RDI + 0xa0) & 1) == 0) {
      prepare(in_stack_fffffffffffffeb0);
    }
    if (view::upDir != *(int *)(in_RDI + 0xa4)) {
      populateGroundPlaneGeometry(in_stack_fffffffffffffba0);
    }
    anon_unknown_5::getGroundPlaneAxisAndSign();
    std::tie<int,float>((int *)in_stack_fffffffffffff988,(float *)in_stack_fffffffffffff980);
    std::tuple<int&,float&>::operator=
              ((tuple<int_&,_float_&> *)in_stack_fffffffffffff980,
               (tuple<int,_float> *)in_stack_fffffffffffff978);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)local_3c,0.0,0.0,0.0);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_48,0.0,0.0,0.0);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_54,0.0,0.0,0.0);
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](local_3c,local_10);
    fVar14 = local_14;
    *pfVar4 = 1.0;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_48,(local_10 + 1) % 3);
    fVar1 = local_14;
    *pfVar4 = fVar14;
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_54,(local_10 + 2) % 3);
    *pfVar4 = fVar1;
    if ((local_14 != 1.0) || (NAN(local_14))) {
      p_Var6 = std::get<1ul,glm::vec<3,float,(glm::qualifier)0>,glm::vec<3,float,(glm::qualifier)0>>
                         ((tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
                           *)0x37a49e);
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](p_Var6,local_10);
      local_5ac = *pfVar4;
    }
    else {
      p_Var5 = std::get<0ul,glm::vec<3,float,(glm::qualifier)0>,glm::vec<3,float,(glm::qualifier)0>>
                         ((tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
                           *)0x37a474);
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](p_Var5,local_10);
      local_5ac = *pfVar4;
    }
    local_60 = (double)local_5ac;
    p_Var6 = std::get<1ul,glm::vec<3,float,(glm::qualifier)0>,glm::vec<3,float,(glm::qualifier)0>>
                       ((tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
                         *)0x37a4e4);
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](p_Var6,local_10);
    fVar14 = *pfVar4;
    p_Var5 = std::get<0ul,glm::vec<3,float,(glm::qualifier)0>,glm::vec<3,float,(glm::qualifier)0>>
                       ((tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
                         *)0x37a50d);
    pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](p_Var5,local_10);
    dVar2 = local_60;
    local_68 = (double)(fVar14 - *pfVar4);
    local_70 = polyscope::state::lengthScale * 0.0001;
    fVar14 = ScaledValue<float>::asAbsolute((ScaledValue<float> *)&options::groundPlaneHeightFactor)
    ;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar2;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = (double)local_14;
    auVar21 = ZEXT856(0);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (double)fVar14 + local_70;
    auVar15 = vfnmadd213sd_fma(auVar15,auVar19,auVar22);
    auVar18 = ZEXT856(auVar15._8_8_);
    local_78 = auVar15._0_8_;
    vVar23 = Engine::getCurrentViewport(engine);
    auVar20._0_8_ = vVar23._8_8_;
    auVar20._8_56_ = auVar21;
    auVar13._0_8_ = vVar23._0_8_;
    auVar13._8_56_ = auVar18;
    local_88._0_8_ = vmovlpd_avx(auVar13._0_16_);
    local_88._8_8_ = vmovlpd_avx(auVar20._0_16_);
    pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](&local_88,2);
    fVar14 = *pfVar4;
    pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](&local_88,3);
    glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_90,fVar14,*pfVar4);
    local_94 = Engine::getSSAAFactor(engine);
    local_d0 = &local_90;
    local_c8 = &local_48;
    local_c0 = &local_54;
    local_b8 = &local_10;
    local_b0 = &local_14;
    local_a8 = local_3c;
    local_a0 = &local_78;
    if (((local_9 & 1) == 0) && (options::groundPlaneMode == 2)) {
      uVar27 = 0;
      (*engine->_vptr_Engine[0xb])();
      (*engine->_vptr_Engine[10])(engine,(ulong)uVar27);
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37a731);
      (*peVar7->_vptr_FrameBuffer[0xb])
                (peVar7,(ulong)(uint)((local_94 * view::bufferWidth) / 2),
                 (ulong)(uint)((local_94 * view::bufferHeight) / 2));
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37a787);
      (*peVar7->_vptr_FrameBuffer[10])
                (peVar7,(ulong)uVar27,(ulong)uVar27,
                 (ulong)(uint)((local_94 * view::bufferWidth) / 2),
                 (ulong)(uint)((local_94 * view::bufferHeight) / 2));
      Engine::setCurrentPixelScaling(engine,(float)local_94 * 0.5);
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37a801);
      (*peVar7->_vptr_FrameBuffer[3])();
      scalar = 0.0;
      pvVar8 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_fffffffffffff980,
                          (size_type)in_stack_fffffffffffff978);
      fVar14 = *pvVar8;
      pvVar8 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_fffffffffffff980,
                          (size_type)in_stack_fffffffffffff978);
      fVar1 = *pvVar8;
      pvVar8 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_fffffffffffff980,
                          (size_type)in_stack_fffffffffffff978);
      glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_e4,fVar14,fVar1,*pvVar8);
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37a88c);
      (peVar7->clearColor).field_2 = local_e4.field_2;
      (peVar7->clearColor).field_0 = local_e4.field_0;
      (peVar7->clearColor).field_1 = local_e4.field_1;
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37a8af);
      (*peVar7->_vptr_FrameBuffer[4])();
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37a8c8);
      (*peVar7->_vptr_FrameBuffer[3])();
      auVar13 = vmovdqu64_avx512f(view::viewMat);
      local_128 = vmovdqu64_avx512f(auVar13);
      auVar18 = ZEXT856(0);
      vVar24 = glm::operator*(in_stack_fffffffffffff990,
                              (float)((ulong)in_stack_fffffffffffff988 >> 0x20));
      auVar16._0_8_ = vVar24._0_8_;
      auVar16._8_56_ = auVar18;
      vmovlpd_avx(auVar16._0_16_);
      glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
                ((mat<3,_3,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff980,
                 (float)((ulong)in_stack_fffffffffffff978 >> 0x20));
      glm::outerProduct<3,3,float,(glm::qualifier)0>
                ((vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                 in_stack_fffffffffffff9b8);
      v = local_1b4;
      glm::operator*(scalar,(mat<3,_3,_float,_(glm::qualifier)0> *)
                            CONCAT44(uVar27,in_stack_fffffffffffff9e8));
      glm::operator-((mat<3,_3,_float,_(glm::qualifier)0> *)
                     CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                     (mat<3,_3,_float,_(glm::qualifier)0> *)v);
      glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                ((vec<3,float,(glm::qualifier)0> *)local_1e4,0.0,0.0,0.0);
      fVar14 = (float)-local_78;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](local_1e4,local_10);
      auVar18 = (undefined1  [56])0x0;
      *pfVar4 = fVar14;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff980,
                 (float *)in_stack_fffffffffffff978);
      vVar24 = glm::operator-(in_stack_fffffffffffff980);
      auVar17._0_8_ = vVar24._0_8_;
      auVar17._8_56_ = auVar18;
      vmovlpd_avx(auVar17._0_16_);
      glm::translate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(fVar14,in_stack_fffffffffffffa20),v
                );
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff990,
                 in_stack_fffffffffffff988);
      glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28);
      in_stack_fffffffffffffc34 = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff980,
                 (float *)in_stack_fffffffffffff978);
      glm::translate<float,(glm::qualifier)0>
                ((mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(fVar14,in_stack_fffffffffffffa20),v
                );
      glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28);
      glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28);
      memcpy(view::viewMat,local_40c,0x40);
      bVar3 = Engine::transparencyEnabled(engine);
      if (!bVar3) {
        drawStructures();
      }
      memcpy(view::viewMat,local_128,0x40);
    }
    if (((local_9 & 1) == 0) && (options::groundPlaneMode == 3)) {
      (*engine->_vptr_Engine[0xb])(engine,0);
      (*engine->_vptr_Engine[10])(engine,0);
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37abde);
      (*peVar7->_vptr_FrameBuffer[0xb])
                (peVar7,(ulong)(uint)(local_94 * view::bufferWidth),
                 (ulong)(uint)(local_94 * view::bufferHeight));
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37ac1a);
      (*peVar7->_vptr_FrameBuffer[10])
                (peVar7,0,0,(ulong)(uint)(local_94 * view::bufferWidth),
                 (ulong)(uint)(local_94 * view::bufferHeight));
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37ac5c);
      (*peVar7->_vptr_FrameBuffer[3])();
      pvVar8 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_fffffffffffff980,
                          (size_type)in_stack_fffffffffffff978);
      fVar14 = *pvVar8;
      pvVar8 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_fffffffffffff980,
                          (size_type)in_stack_fffffffffffff978);
      fVar1 = *pvVar8;
      pvVar8 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_fffffffffffff980,
                          (size_type)in_stack_fffffffffffff978);
      glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_418,fVar14,fVar1,*pvVar8);
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37acd9);
      (peVar7->clearColor).field_0 = local_418.field_0;
      (peVar7->clearColor).field_1 = local_418.field_1;
      (peVar7->clearColor).field_2 = local_418.field_2;
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37ad00);
      (*peVar7->_vptr_FrameBuffer[4])();
      for (local_41c = 0; local_41c < 2; local_41c = local_41c + 1) {
        std::array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL>::operator[]
                  ((array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL> *)
                   in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978);
        peVar7 = std::
                 __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x37ad43);
        (*peVar7->_vptr_FrameBuffer[0xb])
                  (peVar7,(long)(local_94 * view::bufferWidth) / 2 & 0xffffffff,
                   (long)(local_94 * view::bufferHeight) / 2 & 0xffffffff);
        std::array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL>::operator[]
                  ((array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL> *)
                   in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978);
        peVar7 = std::
                 __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x37ada3);
        (*peVar7->_vptr_FrameBuffer[10])
                  (peVar7,0,0,(long)(local_94 * view::bufferWidth) / 2 & 0xffffffff,
                   (long)(local_94 * view::bufferHeight) / 2 & 0xffffffff);
        std::array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL>::operator[]
                  ((array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL> *)
                   in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978);
        peVar7 = std::
                 __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x37ae08);
        (*peVar7->_vptr_FrameBuffer[4])();
      }
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37ae38);
      (*peVar7->_vptr_FrameBuffer[3])();
      memcpy(&stack0xfffffffffffffba4,view::viewMat,0x40);
      local_4a0 = 0x3f800000;
      glm::mat<4,_4,_float,_(glm::qualifier)0>::mat
                ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffff980,
                 (float *)in_stack_fffffffffffff978);
      pcVar9 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                         ((mat<4,_4,_float,_(glm::qualifier)0> *)&stack0xfffffffffffffb64,local_10);
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar9,local_10);
      *pfVar4 = 0.0;
      fVar14 = (float)local_78;
      pcVar9 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                         ((mat<4,_4,_float,_(glm::qualifier)0> *)&stack0xfffffffffffffb64,3);
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar9,local_10);
      *pfVar4 = fVar14;
      glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28);
      memcpy(view::viewMat,local_4e0,0x40);
      (*engine->_vptr_Engine[10])(engine,0);
      (*engine->_vptr_Engine[0xb])(engine,7);
      drawStructures();
      (*engine->_vptr_Engine[0xb])(engine,7);
      std::array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL>::operator[]
                ((array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL> *)
                 in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978);
      peVar7 = std::
               __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x37af7c);
      (*peVar7->_vptr_FrameBuffer[3])();
      peVar10 = std::
                __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x37af99);
      (*peVar10->_vptr_ShaderProgram[0x1e])();
      iVar26 = options::shadowBlurIters;
      local_4e4 = Engine::getSSAAFactor(engine);
      local_4e4 = iVar26 * local_4e4;
      for (local_4e8 = 0; local_4e8 < local_4e4; local_4e8 = local_4e8 + 1) {
        std::array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL>::operator[]
                  ((array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL> *)
                   in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978);
        peVar7 = std::
                 __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x37b00e);
        (*peVar7->_vptr_FrameBuffer[3])();
        peVar10 = std::
                  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x37b02b);
        paVar25 = &local_509;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_508,"t_image",paVar25);
        p_Var11 = &std::array<std::shared_ptr<polyscope::render::TextureBuffer>,_2UL>::operator[]
                             ((array<std::shared_ptr<polyscope::render::TextureBuffer>,_2UL> *)
                              in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978)->
                   super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
        peVar12 = std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::
                  get(p_Var11);
        (*peVar10->_vptr_ShaderProgram[0x1a])(peVar10,local_508,peVar12);
        std::__cxx11::string::~string(local_508);
        std::allocator<char>::~allocator((allocator<char> *)&local_509);
        peVar10 = std::
                  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x37b0c3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_540,"u_horizontal",&local_541);
        (*peVar10->_vptr_ShaderProgram[3])(peVar10,local_540,1);
        std::__cxx11::string::~string(local_540);
        std::allocator<char>::~allocator((allocator<char> *)&local_541);
        peVar10 = std::
                  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x37b142);
        (*peVar10->_vptr_ShaderProgram[0x1e])();
        std::array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL>::operator[]
                  ((array<std::shared_ptr<polyscope::render::FrameBuffer>,_2UL> *)
                   in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978);
        peVar7 = std::
                 __shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x37b16e);
        (*peVar7->_vptr_FrameBuffer[3])();
        peVar10 = std::
                  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x37b184);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_568,"t_image",&local_569);
        p_Var11 = &std::array<std::shared_ptr<polyscope::render::TextureBuffer>,_2UL>::operator[]
                             ((array<std::shared_ptr<polyscope::render::TextureBuffer>,_2UL> *)
                              in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978)->
                   super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
        peVar12 = std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::
                  get(p_Var11);
        (*peVar10->_vptr_ShaderProgram[0x1a])(peVar10,local_568,peVar12);
        std::__cxx11::string::~string(local_568);
        std::allocator<char>::~allocator((allocator<char> *)&local_569);
        in_stack_fffffffffffff978 =
             std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x37b21d);
        in_stack_fffffffffffff980 = (vec<3,_float,_(glm::qualifier)0> *)local_591;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_591 + 1),"u_horizontal",(allocator *)in_stack_fffffffffffff980);
        (*in_stack_fffffffffffff978->_vptr_ShaderProgram[3])
                  (in_stack_fffffffffffff978,local_591 + 1,0);
        std::__cxx11::string::~string((string *)(local_591 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_591);
        peVar10 = std::
                  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x37b295);
        (*peVar10->_vptr_ShaderProgram[0x1e])();
      }
      memcpy(view::viewMat,&stack0xfffffffffffffba4,0x40);
    }
    (*engine->_vptr_Engine[6])();
    (*engine->_vptr_Engine[0x24])();
    if (options::transparencyMode != 1) {
      (*engine->_vptr_Engine[0xb])(engine,7);
    }
    draw::anon_class_64_8_eb2a8976::operator()(in_stack_fffffffffffffd50);
    peVar10 = std::
              __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x37b452);
    (*peVar10->_vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void GroundPlane::draw(bool isRedraw) {
  if (options::groundPlaneMode == GroundPlaneMode::None) {
    return;
  }

  // don't draw ground in planar mode
  if (view::style == view::NavigateStyle::Planar) return;

  if (!groundPlanePrepared) {
    prepare();
  }
  if (view::upDir != groundPlaneViewCached) {
    populateGroundPlaneGeometry();
  }

  // Get logical "up" direction to which the ground plane is oriented
  int iP;
  float sign;
  std::tie(iP, sign) = getGroundPlaneAxisAndSign();

  glm::vec3 baseUp{0., 0., 0.};
  glm::vec3 baseForward{0., 0., 0.};
  glm::vec3 baseRight{0., 0., 0.};
  baseUp[iP] = 1.;
  baseForward[(iP + 1) % 3] = sign;
  baseRight[(iP + 2) % 3] = sign;

  // Location for ground plane
  double bboxBottom = sign == 1.0 ? std::get<0>(state::boundingBox)[iP] : std::get<1>(state::boundingBox)[iP];
  double bboxHeight = std::get<1>(state::boundingBox)[iP] - std::get<0>(state::boundingBox)[iP];
  double heightEPS = state::lengthScale * 1e-4;
  double groundHeight = bboxBottom - sign * (options::groundPlaneHeightFactor.asAbsolute() + heightEPS);

  // Viewport
  glm::vec4 viewport = render::engine->getCurrentViewport();
  glm::vec2 viewportDim{viewport[2], viewport[3]};
  int factor = render::engine->getSSAAFactor();

  auto setUniforms = [&]() {
    glm::mat4 viewMat = view::getCameraViewMatrix();
    groundPlaneProgram->setUniform("u_viewMatrix", glm::value_ptr(viewMat));

    glm::mat4 projMat = view::getCameraPerspectiveMatrix();
    groundPlaneProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
    groundPlaneProgram->setUniform("u_viewportDim", viewportDim);

    if (options::groundPlaneMode == GroundPlaneMode::Tile ||
        options::groundPlaneMode == GroundPlaneMode::TileReflection) {
      groundPlaneProgram->setUniform("u_center", state::center);
      groundPlaneProgram->setUniform("u_basisX", baseForward);
      groundPlaneProgram->setUniform("u_basisY", baseRight);
    }

    if (options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {
      groundPlaneProgram->setUniform("u_shadowDarkness", options::shadowDarkness);
    }

    float camHeight = view::getCameraWorldPosition()[iP];
    groundPlaneProgram->setUniform("u_cameraHeight", camHeight);
    groundPlaneProgram->setUniform("u_upSign", sign);
    groundPlaneProgram->setUniform("u_basisZ", baseUp);
    groundPlaneProgram->setUniform("u_groundHeight", groundHeight);
    groundPlaneProgram->setUniform("u_lengthScale", state::lengthScale);
  };

  /*
  // For all effects which will use the alternate scene buffers, prepare them
  if (options::groundPlaneMode == GroundPlaneMode::TileReflection ||
      options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {


    sceneAltFrameBuffer->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    render::engine->setCurrentPixelScaling(factor / 2.);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();
  }
  */

  // Render the scene to implement the mirror effect
  if (!isRedraw && options::groundPlaneMode == GroundPlaneMode::TileReflection) {

    // Prepare the alternate scene buffers
    // (use a texture 1/4 the area of the view buffer, it's supposed to be blurry anyway and this saves perf)
    render::engine->setBlendMode();
    render::engine->setDepthMode();
    sceneAltFrameBuffer->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
    render::engine->setCurrentPixelScaling(factor / 2.);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();

    // Render to a texture so we can sample from it on the ground
    sceneAltFrameBuffer->bindForRendering();

    // Push a reflected view matrix
    glm::mat4 origViewMat = view::viewMat;

    glm::vec3 mirrorN = baseUp * sign;
    glm::mat3 mirrorMat3 = glm::mat3(1.0) - 2.0f * glm::outerProduct(mirrorN, mirrorN);
    glm::vec3 tVec{0., 0., 0.};
    tVec[iP] = -groundHeight;
    glm::mat4 mirrorMat =
        glm::translate(glm::mat4(1.0), -tVec) * glm::mat4(mirrorMat3) * glm::translate(glm::mat4(1.0), tVec);
    view::viewMat = view::viewMat * mirrorMat;

    // Draw everything
    if (!render::engine->transparencyEnabled()) { // skip when transparency is turned on
      drawStructures();
    }

    // Restore original view matrix
    view::viewMat = origViewMat;
  }

  // Render the scene to implement the shadow effect
  if (!isRedraw && options::groundPlaneMode == GroundPlaneMode::ShadowOnly) {

    // Prepare the alternate scene buffers
    render::engine->setBlendMode();
    render::engine->setDepthMode();
    sceneAltFrameBuffer->resize(factor * view::bufferWidth, factor * view::bufferHeight);
    sceneAltFrameBuffer->setViewport(0, 0, factor * view::bufferWidth, factor * view::bufferHeight);

    sceneAltFrameBuffer->bindForRendering();
    sceneAltFrameBuffer->clearColor = {view::bgColor[0], view::bgColor[1], view::bgColor[2]};
    sceneAltFrameBuffer->clear();

    // Make sure all framebuffers are the right shape
    for (int i = 0; i < 2; i++) {
      blurFrameBuffers[i]->resize(factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
      blurFrameBuffers[i]->setViewport(0, 0, factor * view::bufferWidth / 2, factor * view::bufferHeight / 2);
      blurFrameBuffers[i]->clear();
    }

    // Render to a texture so we can sample from it on the ground
    sceneAltFrameBuffer->bindForRendering();

    // Push a view matrix which projects on to the ground plane
    glm::mat4 origViewMat = view::viewMat;
    glm::mat4 projMat = glm::mat4(1.0);
    projMat[iP][iP] = 0.;
    projMat[3][iP] = groundHeight;
    view::viewMat = view::viewMat * projMat;

    // Draw everything
    render::engine->setDepthMode();
    render::engine->setBlendMode(BlendMode::Disable);
    drawStructures();

    // Copy the depth buffer to a texture (while upsampling)
    render::engine->setBlendMode(BlendMode::Disable);
    blurFrameBuffers[0]->bindForRendering();
    copyTexProgram->draw();

    // == Blur

    // Do some blur iterations (ends in same buffer it started in)
    int nBlur = options::shadowBlurIters * render::engine->getSSAAFactor();
    // int nBlur = 0;
    for (int i = 0; i < nBlur; i++) {
      // horizontal blur
      blurFrameBuffers[1]->bindForRendering();
      blurProgram->setTextureFromBuffer("t_image", blurColorTextures[0].get());
      blurProgram->setUniform("u_horizontal", 1);
      blurProgram->draw();

      // vertical blur
      blurFrameBuffers[0]->bindForRendering();
      blurProgram->setTextureFromBuffer("t_image", blurColorTextures[1].get());
      blurProgram->setUniform("u_horizontal", 0);
      blurProgram->draw();
    }

    // Restore original view matrix
    view::viewMat = origViewMat;
  }

  render::engine->bindSceneBuffer();

  // Render the ground plane
  render::engine->applyTransparencySettings();
  if (options::transparencyMode != TransparencyMode::Simple) {
    render::engine->setBlendMode(BlendMode::Disable);
  }
  setUniforms();
  groundPlaneProgram->draw();
}